

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

LPCWSTR __thiscall
Js::RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap>::Value
          (RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap> *this,int radix)

{
  StringBuilder<Memory::ArenaAllocator> *this_00;
  uint uVar1;
  char16 *pcVar2;
  
  this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
            stringBuilder;
  this_00->length = 0;
  this_00->count = 0;
  this_00->firstChunk = (Data *)0x0;
  this_00->secondChunk = (Data *)0x0;
  this_00->lastChunk = (Data *)0x0;
  StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<8ul>(this_00,(char16 (*) [8])L"size = ");
  uVar1 = (*(this->walker->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
  StringBuilder<Memory::ArenaAllocator>::AppendUint64(this_00,(ulong)uVar1);
  pcVar2 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
  return pcVar2;
}

Assistant:

LPCWSTR RecyclableCollectionObjectDisplay<TData>::Value(int radix)
    {
        StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
        builder->Reset();

        builder->AppendCppLiteral(_u("size = "));
        builder->AppendUint64(walker->GetChildrenCount());

        return builder->Detach();
    }